

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromMemory
          (TinyGLTF *this,Model *model,string *err,string *warn,uchar *bytes,uint size,
          string *base_dir,uint check_sections)

{
  uint uVar1;
  ulong uVar2;
  uint local_cc;
  uint uStack_c8;
  bool ret;
  uint chunk1_format;
  uint chunk1_length;
  __cxx11 local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  ulong local_58;
  uint64_t header_and_json_size;
  uint local_48;
  uint chunk0_format;
  uint chunk0_length;
  uint length;
  uint version;
  uint size_local;
  uchar *bytes_local;
  string *warn_local;
  string *err_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  length = size;
  _version = bytes;
  bytes_local = (uchar *)warn;
  warn_local = err;
  err_local = (string *)model;
  model_local = (Model *)this;
  if (size < 0x14) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator=((string *)err,"Too short data size for glTF Binary.");
    }
    this_local._7_1_ = false;
  }
  else if ((((*bytes == 'g') && (bytes[1] == 'l')) && (bytes[2] == 'T')) && (bytes[3] == 'F')) {
    chunk0_length = *(uint *)(bytes + 4);
    swap4(&chunk0_length);
    chunk0_format = *(uint *)(_version + 8);
    swap4(&chunk0_format);
    local_48 = *(uint *)(_version + 0xc);
    swap4(&local_48);
    header_and_json_size._4_4_ = *(int *)(_version + 0x10);
    swap4((uint *)((long)&header_and_json_size + 4));
    uVar2 = (ulong)local_48;
    local_58 = uVar2 + 0x14;
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if ((ulong)uVar1 < uVar2 + 0x14) {
      if (warn_local != (string *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)warn_local,"Invalid glTF binary. GLB data exceeds 4GB.");
      }
      this_local._7_1_ = false;
    }
    else if (((length < local_58) || (local_48 == 0)) ||
            ((length < chunk0_format ||
             ((chunk0_format < local_58 || (header_and_json_size._4_4_ != 0x4e4f534a)))))) {
      if (warn_local != (string *)0x0) {
        std::__cxx11::string::operator=((string *)warn_local,"Invalid glTF binary.");
      }
      this_local._7_1_ = false;
    }
    else if ((local_58 & 3) == 0) {
      if (local_58 == chunk0_format) {
        this->bin_data_ = (uchar *)0x0;
        this->bin_size_ = 0;
      }
      else {
        if ((ulong)chunk0_format < local_58 + 8) {
          if (warn_local != (string *)0x0) {
            std::__cxx11::to_string(local_b8,(local_58 - chunk0_format) + 8);
            std::operator+((char *)local_98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Insufficient storage space for Chunk1(BIN data). At least Chunk1 Must have 8 or more bytes, but got "
                          );
            std::operator+(local_78,(char *)local_98);
            std::__cxx11::string::operator=((string *)warn_local,(string *)local_78);
            std::__cxx11::string::~string((string *)local_78);
            std::__cxx11::string::~string(local_98);
            std::__cxx11::string::~string((string *)local_b8);
          }
          return false;
        }
        local_cc = 0;
        uStack_c8 = *(uint *)(_version + local_58);
        swap4(&stack0xffffffffffffff38);
        local_cc = *(uint *)(_version + local_58 + 4);
        swap4(&local_cc);
        if (local_cc != 0x4e4942) {
          if (warn_local != (string *)0x0) {
            std::__cxx11::string::operator=((string *)warn_local,"Invalid chunkType for Chunk1.");
          }
          return false;
        }
        if (uStack_c8 == 0) {
          if ((ulong)chunk0_format < local_58 + 8) {
            if (warn_local != (string *)0x0) {
              std::__cxx11::string::operator=
                        ((string *)warn_local,"BIN Chunk header location exceeds the GLB size.");
            }
            return false;
          }
          this->bin_data_ = (uchar *)0x0;
        }
        else {
          if (uStack_c8 < 4) {
            if (warn_local != (string *)0x0) {
              std::__cxx11::string::operator=
                        ((string *)warn_local,"Insufficient Chunk1(BIN) data size.");
            }
            return false;
          }
          if ((uStack_c8 & 3) != 0) {
            if (this->strictness_ != Permissive) {
              if (warn_local != (string *)0x0) {
                std::__cxx11::string::operator=
                          ((string *)warn_local,"BIN Chunk end is not aligned to a 4-byte boundary."
                          );
              }
              return false;
            }
            if (bytes_local != (uchar *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)bytes_local,
                         "BIN Chunk end is not aligned to a 4-byte boundary.\n");
            }
          }
          if ((ulong)chunk0_format < uStack_c8 + local_58 + 8) {
            if (warn_local != (string *)0x0) {
              std::__cxx11::string::operator=
                        ((string *)warn_local,"BIN Chunk data length exceeds the GLB size.");
            }
            return false;
          }
          this->bin_data_ = _version + local_58 + 8;
        }
        this->bin_size_ = (ulong)uStack_c8;
      }
      this->is_binary_ = true;
      this_local._7_1_ =
           LoadFromString(this,(Model *)err_local,warn_local,(string *)bytes_local,
                          (char *)(_version + 0x14),local_48,base_dir,check_sections);
      if (this_local._7_1_) {
        this_local._7_1_ = true;
      }
    }
    else {
      if (warn_local != (string *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)warn_local,"JSON Chunk end does not aligned to a 4-byte boundary.");
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator=((string *)err,"Invalid magic.");
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TinyGLTF::LoadBinaryFromMemory(Model *model, std::string *err,
                                    std::string *warn,
                                    const unsigned char *bytes,
                                    unsigned int size,
                                    const std::string &base_dir,
                                    unsigned int check_sections) {
  if (size < 20) {
    if (err) {
      (*err) = "Too short data size for glTF Binary.";
    }
    return false;
  }

  if (bytes[0] == 'g' && bytes[1] == 'l' && bytes[2] == 'T' &&
      bytes[3] == 'F') {
    // ok
  } else {
    if (err) {
      (*err) = "Invalid magic.";
    }
    return false;
  }

  unsigned int version;        // 4 bytes
  unsigned int length;         // 4 bytes
  unsigned int chunk0_length;  // 4 bytes
  unsigned int chunk0_format;  // 4 bytes;

  memcpy(&version, bytes + 4, 4);
  swap4(&version);
  memcpy(&length, bytes + 8, 4); // Total glb size, including header and all chunks.
  swap4(&length);
  memcpy(&chunk0_length, bytes + 12, 4);  // JSON data length
  swap4(&chunk0_length);
  memcpy(&chunk0_format, bytes + 16, 4);
  swap4(&chunk0_format);

  // https://registry.khronos.org/glTF/specs/2.0/glTF-2.0.html#binary-gltf-layout
  //
  // In case the Bin buffer is not present, the size is exactly 20 + size of
  // JSON contents,
  // so use "greater than" operator.
  //
  // https://github.com/syoyo/tinygltf/issues/372
  // Use 64bit uint to avoid integer overflow.
  uint64_t header_and_json_size = 20ull + uint64_t(chunk0_length);

  if (header_and_json_size > (std::numeric_limits<uint32_t>::max)()) {
    // Do not allow 4GB or more GLB data.
    if (err) {
      (*err) = "Invalid glTF binary. GLB data exceeds 4GB.";
    }
    return false;
  }

  if ((header_and_json_size > uint64_t(size)) || (chunk0_length < 1) ||
      (length > size) || (header_and_json_size > uint64_t(length)) ||
      (chunk0_format != 0x4E4F534A)) {  // 0x4E4F534A = JSON format.
    if (err) {
      (*err) = "Invalid glTF binary.";
    }
    return false;
  }

  // Padding check
  // The start and the end of each chunk must be aligned to a 4-byte boundary.
  // No padding check for chunk0 start since its 4byte-boundary is ensured.
  if ((header_and_json_size % 4) != 0) {
    if (err) {
      (*err) = "JSON Chunk end does not aligned to a 4-byte boundary.";
    }
    return false;
  }

  // std::cout << "header_and_json_size = " << header_and_json_size << "\n";
  // std::cout << "length = " << length << "\n";

  // Chunk1(BIN) data
  // The spec says: When the binary buffer is empty or when it is stored by
  // other means, this chunk SHOULD be omitted. So when header + JSON data ==
  // binary size, Chunk1 is omitted.
  if (header_and_json_size == uint64_t(length)) {
    bin_data_ = nullptr;
    bin_size_ = 0;
  } else {
    // Read Chunk1 info(BIN data)
    //
    // issue-440:
    // 'SHOULD' in glTF spec means 'RECOMMENDED',
    // So there is a situation that Chunk1(BIN) is composed of zero-sized BIN data
    // (chunksize(0) + binformat(BIN) = 8bytes).
    //
    if ((header_and_json_size + 8ull) > uint64_t(length)) {
      if (err) {
        (*err) =
            "Insufficient storage space for Chunk1(BIN data). At least Chunk1 "
            "Must have 8 or more bytes, but got " +
            std::to_string((header_and_json_size + 8ull) - uint64_t(length)) +
            ".\n";
      }
      return false;
    }

    unsigned int chunk1_length{0};  // 4 bytes
    unsigned int chunk1_format{0};  // 4 bytes;
    memcpy(&chunk1_length, bytes + header_and_json_size,
           4);  // Bin data length
    swap4(&chunk1_length);
    memcpy(&chunk1_format, bytes + header_and_json_size + 4, 4);
    swap4(&chunk1_format);

    if (chunk1_format != 0x004e4942) {
      if (err) {
        (*err) = "Invalid chunkType for Chunk1.";
      }
      return false;
    }

    if (chunk1_length == 0) {

      if (header_and_json_size + 8 > uint64_t(length)) {
        if (err) {
          (*err) = "BIN Chunk header location exceeds the GLB size.";
        }
        return false;
      }

      bin_data_ = nullptr;

    } else {

      // When BIN chunk size is not zero, at least Chunk1 should have 12 bytes(8 bytes(header) + 4 bytes(bin
      // payload could be 1~3 bytes, but need to be aligned to 4 bytes)

      if (chunk1_length < 4) {
        if (err) {
          (*err) = "Insufficient Chunk1(BIN) data size.";
        }
        return false;
      }

      if ((chunk1_length % 4) != 0) {
        if (strictness_==ParseStrictness::Permissive) {
          if (warn) {
            (*warn) += "BIN Chunk end is not aligned to a 4-byte boundary.\n";
          }
        }
        else {
          if (err) {
            (*err) = "BIN Chunk end is not aligned to a 4-byte boundary.";
          }
          return false;
        }
      }

      // +8 chunk1 header size.
      if (uint64_t(chunk1_length) + header_and_json_size + 8 > uint64_t(length)) {
        if (err) {
          (*err) = "BIN Chunk data length exceeds the GLB size.";
        }
        return false;
      }

      bin_data_ = bytes + header_and_json_size +
                  8;  // 4 bytes (bin_buffer_length) + 4 bytes(bin_buffer_format)
    }

    bin_size_ = size_t(chunk1_length);
  }

  is_binary_ = true;

  bool ret = LoadFromString(model, err, warn,
                            reinterpret_cast<const char *>(&bytes[20]),
                            chunk0_length, base_dir, check_sections);
  if (!ret) {
    return ret;
  }

  return true;
}